

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManStop(Aig_RMan_t *p)

{
  int *piVar1;
  ulong uVar2;
  
  printf("Total funcs    = %10d\n",(ulong)(uint)p->nTotal);
  printf("Full DSD funcs = %10d\n",(ulong)(uint)p->nTtDsd);
  printf("Part DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdPart);
  printf("Non- DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdNot);
  printf("Uniq-var funcs = %10d\n",(ulong)(uint)p->nUniqueVars);
  printf("Unique   funcs = %10d\n");
  puts("Distribution of functions:");
  piVar1 = p->nVarFuncs + 5;
  for (uVar2 = 5; (long)uVar2 <= (long)p->nVars; uVar2 = uVar2 + 1) {
    printf("%2d = %8d\n",uVar2 & 0xffffffff,(ulong)(uint)*piVar1);
    piVar1 = piVar1 + 1;
  }
  Aig_MmFlexStop(p->pMemTrus,0);
  Aig_ManStop(p->pAig);
  Bdc_ManFree(p->pBidec);
  free(p->pBins);
  free(p);
  return;
}

Assistant:

void Aig_RManStop( Aig_RMan_t * p )
{
    int i;
    printf( "Total funcs    = %10d\n", p->nTotal );
    printf( "Full DSD funcs = %10d\n", p->nTtDsd );
    printf( "Part DSD funcs = %10d\n", p->nTtDsdPart );
    printf( "Non- DSD funcs = %10d\n", p->nTtDsdNot );
    printf( "Uniq-var funcs = %10d\n", p->nUniqueVars );
    printf( "Unique   funcs = %10d\n", p->nEntries );
    printf( "Distribution of functions:\n" );
    for ( i = 5; i <= p->nVars; i++ )
        printf( "%2d = %8d\n", i, p->nVarFuncs[i] );
    Aig_MmFlexStop( p->pMemTrus, 0 );
    Aig_ManStop( p->pAig );
    Bdc_ManFree( p->pBidec );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}